

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::AddSubDirectory
          (cmMakefile *this,string *srcPath,string *binPath,bool excludeFromAll,bool immediate)

{
  cmCommandContext *entryPointCommand;
  undefined4 uVar1;
  bool bVar2;
  cmMakefile *this_00;
  undefined3 in_register_00000081;
  cmMakefile *subMf;
  Snapshot newSnapshot;
  allocator local_7d;
  undefined4 local_7c;
  cmMakefile *local_78;
  Directory local_70;
  Snapshot local_48;
  
  bVar2 = EnforceUniqueDir(this,srcPath,binPath);
  if (bVar2) {
    entryPointCommand =
         (this->ContextStack).
         super__Vector_base<const_cmCommandContext_*,_std::allocator<const_cmCommandContext_*>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1];
    local_7c = CONCAT31(in_register_00000081,immediate);
    cmState::CreateBuildsystemDirectorySnapshot
              (&local_48,this->GlobalGenerator->CMakeInstance->State,this->StateSnapshot,
               &entryPointCommand->Name,entryPointCommand->Line);
    cmState::Snapshot::GetDirectory(&local_70,&local_48);
    cmState::Directory::SetCurrentSource(&local_70,srcPath);
    cmState::Snapshot::GetDirectory(&local_70,&local_48);
    cmState::Directory::SetCurrentBinary(&local_70,binPath);
    cmsys::SystemTools::MakeDirectory((binPath->_M_dataplus)._M_p);
    this_00 = (cmMakefile *)operator_new(0x730);
    cmMakefile(this_00,this->GlobalGenerator,&local_48);
    local_78 = this_00;
    cmGlobalGenerator::AddMakefile(this->GlobalGenerator,this_00);
    uVar1 = local_7c;
    if (excludeFromAll) {
      std::__cxx11::string::string((string *)&local_70,"EXCLUDE_FROM_ALL",&local_7d);
      SetProperty(this_00,(string *)&local_70,"TRUE");
      std::__cxx11::string::~string((string *)&local_70);
    }
    if ((char)uVar1 == '\0') {
      std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::push_back
                (&this->UnConfiguredDirectories,&local_78);
    }
    else {
      ConfigureSubDirectory(this,this_00);
    }
  }
  return;
}

Assistant:

void cmMakefile::AddSubDirectory(const std::string& srcPath,
                                 const std::string& binPath,
                                 bool excludeFromAll,
                                 bool immediate)
{
  // Make sure the binary directory is unique.
  if(!this->EnforceUniqueDir(srcPath, binPath))
    {
    return;
    }

  cmState::Snapshot newSnapshot = this->GetState()
      ->CreateBuildsystemDirectorySnapshot(this->StateSnapshot,
                                           this->ContextStack.back()->Name,
                                           this->ContextStack.back()->Line);

  newSnapshot.GetDirectory().SetCurrentSource(srcPath);
  newSnapshot.GetDirectory().SetCurrentBinary(binPath);

  cmSystemTools::MakeDirectory(binPath.c_str());

  cmMakefile* subMf = new cmMakefile(this->GlobalGenerator, newSnapshot);
  this->GetGlobalGenerator()->AddMakefile(subMf);

  if(excludeFromAll)
    {
    subMf->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
    }

  if (immediate)
    {
    this->ConfigureSubDirectory(subMf);
    }
  else
    {
    this->UnConfiguredDirectories.push_back(subMf);
    }
}